

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O1

void object_absorb_partial(object *obj1,object *obj2,object_stack_t mode1,object_stack_t mode2)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  _Bool _Var5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  bVar1 = obj1->number;
  bVar2 = obj2->number;
  uVar4 = (uint)bVar2;
  if (bVar1 < bVar2) {
    uVar4 = (uint)bVar1;
  }
  uVar6 = (uint)bVar2;
  if (bVar2 < bVar1) {
    uVar6 = (uint)bVar1;
  }
  if (((mode2 | mode1) & OSTACK_STORE) != OSTACK_NONE) {
    __assert_fail("!(mode1 & OSTACK_STORE) && !(mode2 & OSTACK_STORE)",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-pile.c"
                  ,0x274,
                  "void object_absorb_partial(struct object *, struct object *, object_stack_t, object_stack_t)"
                 );
  }
  if ((mode1 & OSTACK_QUIVER) == OSTACK_NONE) {
    if ((mode2 & OSTACK_QUIVER) != OSTACK_NONE) {
      uVar3 = z_info->quiver_slot_size;
      _Var5 = tval_is_ammo(obj2);
      uVar8 = 1;
      if (!_Var5) {
        uVar8 = (uint)z_info->thrown_quiver_mult;
      }
      uVar8 = uVar3 / uVar8;
      uVar7 = (uVar6 + uVar4) - uVar8;
      if (obj1->kind->base->max_stack <= (int)uVar7) {
        __assert_fail("newsz1 < obj1->kind->base->max_stack",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-pile.c"
                      ,0x28f,
                      "void object_absorb_partial(struct object *, struct object *, object_stack_t, object_stack_t)"
                     );
      }
      goto LAB_00192664;
    }
    uVar7 = obj1->kind->base->max_stack;
  }
  else {
    uVar3 = z_info->quiver_slot_size;
    _Var5 = tval_is_ammo(obj1);
    uVar7 = 1;
    if (!_Var5) {
      uVar7 = (uint)z_info->thrown_quiver_mult;
    }
    uVar7 = uVar3 / uVar7;
    if ((mode2 & OSTACK_QUIVER) == OSTACK_NONE) {
      uVar8 = (uVar6 + uVar4) - uVar7;
      if (obj1->kind->base->max_stack <= (int)uVar8) {
        __assert_fail("newsz2 < obj1->kind->base->max_stack",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-pile.c"
                      ,0x285,
                      "void object_absorb_partial(struct object *, struct object *, object_stack_t, object_stack_t)"
                     );
      }
      goto LAB_00192664;
    }
  }
  uVar8 = (uVar4 + uVar6) - uVar7;
LAB_00192664:
  obj1->number = (uint8_t)uVar7;
  obj2->number = (uint8_t)uVar8;
  object_absorb_merge(obj1,obj2);
  return;
}

Assistant:

void object_absorb_partial(struct object *obj1, struct object *obj2,
	object_stack_t mode1, object_stack_t mode2)
{
	int smallest = MIN(obj1->number, obj2->number);
	int largest = MAX(obj1->number, obj2->number);
	int newsz1, newsz2;

	assert(!(mode1 & OSTACK_STORE) && !(mode2 & OSTACK_STORE));

	/* The quiver can have stricter limits. */
	if (mode1 & OSTACK_QUIVER) {
		int limit = z_info->quiver_slot_size /
			(tval_is_ammo(obj1) ?
			1 : z_info->thrown_quiver_mult);

		if (mode2 & OSTACK_QUIVER) {
			int difference = limit - largest;

			newsz1 = largest + difference;
			newsz2 = smallest - difference;
		} else {
			/* Handle the possibly different limits. */
			newsz1 = limit;
			newsz2 = (largest + smallest) - limit;
			assert(newsz2 < obj1->kind->base->max_stack);
		}
	} else if (mode2 & OSTACK_QUIVER) {
		/* Handle the possibly different limits. */
		int limit = z_info->quiver_slot_size /
			(tval_is_ammo(obj2) ?
			1 : z_info->thrown_quiver_mult);

		newsz1 = (largest + smallest) - limit;
		newsz2 = limit;
		assert(newsz1 < obj1->kind->base->max_stack);
	} else {
		int difference = obj1->kind->base->max_stack - largest;

		newsz1 = largest + difference;
		newsz2 = smallest - difference;
	}

	obj1->number = newsz1;
	obj2->number = newsz2;

	object_absorb_merge(obj1, obj2);
}